

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cc
# Opt level: O0

string * __thiscall
flow::AllocaInstr::to_string_abi_cxx11_(string *__return_storage_ptr__,AllocaInstr *this)

{
  allocator<char> local_39;
  string local_38;
  AllocaInstr *local_18;
  AllocaInstr *this_local;
  
  local_18 = this;
  this_local = (AllocaInstr *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"alloca",&local_39);
  Instr::formatOne(__return_storage_ptr__,&this->super_Instr,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return __return_storage_ptr__;
}

Assistant:

std::string AllocaInstr::to_string() const {
  return formatOne("alloca");
}